

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_target.cpp
# Opt level: O0

bool __thiscall RenderTarget::save_image(RenderTarget *this,string *file)

{
  allocator<Color24> *this_00;
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  reference __a;
  ostream *poVar6;
  Color24 *c;
  iterator __end2;
  iterator __begin2;
  vector<Color24,_std::allocator<Color24>_> *__range2;
  uint32_t x;
  Color24 *b;
  Color24 *a;
  uint32_t y;
  vector<Color24,_std::allocator<Color24>_> img_1;
  undefined1 local_68 [8];
  vector<Color24,_std::allocator<Color24>_> img;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string file_ext;
  string *file_local;
  RenderTarget *this_local;
  
  std::__cxx11::string::rfind((char *)file,0x128263);
  std::__cxx11::string::substr((ulong)local_40,(ulong)file);
  bVar3 = std::operator==(local_40,"ppm");
  if (bVar3) {
    uVar1 = this->width;
    uVar2 = this->height;
    this_00 = (allocator<Color24> *)
              ((long)&img_1.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<Color24>::allocator(this_00);
    std::vector<Color24,_std::allocator<Color24>_>::vector
              ((vector<Color24,_std::allocator<Color24>_> *)local_68,(ulong)(uVar1 * uVar2),this_00)
    ;
    std::allocator<Color24>::~allocator
              ((allocator<Color24> *)
               ((long)&img_1.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    get_colorbuf(this,(vector<Color24,_std::allocator<Color24>_> *)local_68);
    pvVar4 = std::vector<Color24,_std::allocator<Color24>_>::operator[]
                       ((vector<Color24,_std::allocator<Color24>_> *)local_68,0);
    this_local._7_1_ = save_ppm(this,file,&pvVar4->r);
    img_1.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = 1;
    std::vector<Color24,_std::allocator<Color24>_>::~vector
              ((vector<Color24,_std::allocator<Color24>_> *)local_68);
  }
  else {
    bVar3 = std::operator==(local_40,"bmp");
    if (bVar3) {
      uVar1 = this->width;
      uVar2 = this->height;
      std::allocator<Color24>::allocator((allocator<Color24> *)((long)&a + 7));
      std::vector<Color24,_std::allocator<Color24>_>::vector
                ((vector<Color24,_std::allocator<Color24>_> *)&y,(ulong)(uVar1 * uVar2),
                 (allocator<Color24> *)((long)&a + 7));
      std::allocator<Color24>::~allocator((allocator<Color24> *)((long)&a + 7));
      get_colorbuf(this,(vector<Color24,_std::allocator<Color24>_> *)&y);
      for (a._0_4_ = 0; (uint)a < this->height >> 1; a._0_4_ = (uint)a + 1) {
        pvVar4 = std::vector<Color24,_std::allocator<Color24>_>::operator[]
                           ((vector<Color24,_std::allocator<Color24>_> *)&y,
                            (ulong)((uint)a * this->width));
        pvVar5 = std::vector<Color24,_std::allocator<Color24>_>::operator[]
                           ((vector<Color24,_std::allocator<Color24>_> *)&y,
                            (ulong)(((this->height - (uint)a) + -1) * this->width));
        for (__range2._4_4_ = 0; __range2._4_4_ < this->width; __range2._4_4_ = __range2._4_4_ + 1)
        {
          std::swap<Color24>(pvVar4 + __range2._4_4_,pvVar5 + __range2._4_4_);
        }
      }
      __end2 = std::vector<Color24,_std::allocator<Color24>_>::begin
                         ((vector<Color24,_std::allocator<Color24>_> *)&y);
      c = (Color24 *)
          std::vector<Color24,_std::allocator<Color24>_>::end
                    ((vector<Color24,_std::allocator<Color24>_> *)&y);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<Color24_*,_std::vector<Color24,_std::allocator<Color24>_>_>
                                    *)&c);
        if (!bVar3) break;
        __a = __gnu_cxx::
              __normal_iterator<Color24_*,_std::vector<Color24,_std::allocator<Color24>_>_>::
              operator*(&__end2);
        std::swap<unsigned_char>(&__a->r,&__a->b);
        __gnu_cxx::__normal_iterator<Color24_*,_std::vector<Color24,_std::allocator<Color24>_>_>::
        operator++(&__end2);
      }
      pvVar4 = std::vector<Color24,_std::allocator<Color24>_>::operator[]
                         ((vector<Color24,_std::allocator<Color24>_> *)&y,0);
      this_local._7_1_ = save_bmp(this,file,&pvVar4->r);
      img_1.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
      std::vector<Color24,_std::allocator<Color24>_>::~vector
                ((vector<Color24,_std::allocator<Color24>_> *)&y);
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"Unsupported output image format: ");
      poVar6 = std::operator<<(poVar6,(string *)local_40);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
      img_1.super__Vector_base<Color24,_std::allocator<Color24>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool RenderTarget::save_image(const std::string &file) const {
	// Compute the correct image from the saved pixel data and write
	// it to the desired file
	std::string file_ext = file.substr(file.rfind(".") + 1);
	if (file_ext == "ppm"){
		std::vector<Color24> img(width * height);
		get_colorbuf(img);
		return save_ppm(file, &img[0].r);
	}
	if (file_ext == "bmp"){
		std::vector<Color24> img(width * height);
		get_colorbuf(img);
		//Do y-flip for BMP since BMP starts at the bottom-left
		for (uint32_t y = 0; y < height / 2; ++y){
			Color24 *a = &img[y * width];
			Color24 *b = &img[(height - y - 1) * width];
			for (uint32_t x = 0; x < width; ++x){
				std::swap(a[x], b[x]);
			}
		}
		// We also need to convert to BGRA order for BMP
		for (auto &c : img){
			std::swap(c.r, c.b);
		}
		return save_bmp(file, &img[0].r);
	}
	std::cout << "Unsupported output image format: " << file_ext << std::endl;
	return false;
}